

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrappers.pb.cc
# Opt level: O0

void google::protobuf::DoubleValue::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  DoubleValue **v1;
  DoubleValue **v2;
  LogMessage *pLVar1;
  unsigned_long uVar2;
  double local_78;
  undefined4 local_70;
  uint32_t cached_has_bits;
  undefined1 local_60 [16];
  LogMessageFatal local_50 [23];
  Voidify local_39;
  DoubleValue *local_38;
  string *local_30;
  string *absl_log_internal_check_op_result;
  DoubleValue *from;
  DoubleValue *_this;
  MessageLite *from_msg_local;
  MessageLite *to_msg_local;
  
  local_38 = (DoubleValue *)from_msg;
  absl_log_internal_check_op_result = (string *)from_msg;
  from = (DoubleValue *)to_msg;
  _this = (DoubleValue *)from_msg;
  from_msg_local = to_msg;
  v1 = absl::lts_20240722::log_internal::GetReferenceableValue<google::protobuf::DoubleValue_const*>
                 (&local_38);
  v2 = absl::lts_20240722::log_internal::GetReferenceableValue<google::protobuf::DoubleValue*>
                 (&from);
  local_30 = absl::lts_20240722::log_internal::
             Check_NEImpl<google::protobuf::DoubleValue_const*,google::protobuf::DoubleValue*>
                       (v1,v2,"&from != _this");
  if (local_30 != (string *)0x0) {
    local_60 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_30);
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/wrappers.pb.cc"
               ,0x24a,local_60._0_8_,local_60._8_8_);
    pLVar1 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_50);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_39,pLVar1);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_50);
  }
  local_70 = 0;
  local_78 = _internal_value((DoubleValue *)absl_log_internal_check_op_result);
  uVar2 = absl::lts_20240722::bit_cast<unsigned_long,_double,_0>(&local_78);
  if (uVar2 != 0) {
    (from->field_0)._impl_.value_ =
         (double)(absl_log_internal_check_op_result->field_2)._M_allocated_capacity;
  }
  internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(from->super_Message).super_MessageLite._internal_metadata_,
             (InternalMetadata *)&absl_log_internal_check_op_result->_M_string_length);
  return;
}

Assistant:

void DoubleValue::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<DoubleValue*>(&to_msg);
  auto& from = static_cast<const DoubleValue&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.DoubleValue)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  if (::absl::bit_cast<::uint64_t>(from._internal_value()) != 0) {
    _this->_impl_.value_ = from._impl_.value_;
  }
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}